

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktrade.cpp
# Opt level: O2

void __thiscall Kraken::KTrade::KTrade(KTrade *this,JSONNode *node)

{
  JSONNode *pJVar1;
  json_number jVar2;
  json_string local_1e0;
  json_string local_1c0;
  char *local_1a0 [48];
  
  (this->misc)._M_dataplus._M_p = (pointer)&(this->misc).field_2;
  (this->misc)._M_string_length = 0;
  (this->misc).field_2._M_local_buf[0] = '\0';
  pJVar1 = ::JSONNode::operator[](node,0);
  jVar2 = ::JSONNode::as_float(pJVar1);
  this->price = jVar2;
  pJVar1 = ::JSONNode::operator[](node,1);
  jVar2 = ::JSONNode::as_float(pJVar1);
  this->volume = jVar2;
  pJVar1 = ::JSONNode::operator[](node,2);
  ::JSONNode::as_string_abi_cxx11_(&local_1c0,pJVar1);
  std::__cxx11::string::string((string *)&local_1e0,(string *)&local_1c0);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1a0,(string *)&local_1e0,_S_in);
  std::istream::_M_extract<long>((long *)local_1a0);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1a0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  pJVar1 = ::JSONNode::operator[](node,3);
  ::JSONNode::as_string_abi_cxx11_(&local_1e0,pJVar1);
  std::__cxx11::string::string((string *)local_1a0,(string *)&local_1e0);
  this->order = (int)*local_1a0[0];
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::string::~string((string *)&local_1e0);
  pJVar1 = ::JSONNode::operator[](node,4);
  ::JSONNode::as_string_abi_cxx11_(&local_1e0,pJVar1);
  std::__cxx11::string::string((string *)local_1a0,(string *)&local_1e0);
  this->otype = (int)*local_1a0[0];
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::string::~string((string *)&local_1e0);
  pJVar1 = ::JSONNode::operator[](node,5);
  ::JSONNode::as_string_abi_cxx11_(&local_1e0,pJVar1);
  std::__cxx11::string::string((string *)local_1a0,(string *)&local_1e0);
  std::__cxx11::string::operator=((string *)&this->misc,(string *)local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::string::~string((string *)&local_1e0);
  return;
}

Assistant:

KTrade::KTrade(JSONNode node) 
{
   price  = node[0].as_float();
   volume = node[1].as_float();
   std::istringstream( libjson::to_std_string(node[2].as_string()) ) >> time;
   
   order = static_cast<Order_t>
      ( libjson::to_std_string(node[3].as_string())[0] );
   otype = static_cast<Otype_t>
      ( libjson::to_std_string(node[4].as_string())[0] );
   
   misc = libjson::to_std_string(node[5].as_string()); 
}